

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_c_api_tests.c
# Opt level: O0

void encode_whenCppMethodThrowsException_isUnsuccessful(void)

{
  bech32_error bVar1;
  size_t hrplen;
  bech32_bstring *bstring_00;
  bech32_bstring *bstring;
  char local_68 [5];
  uchar dp [3];
  char hrp [85];
  
  memcpy(local_68,
         "aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa",0x55
        );
  bstring._5_2_ = 0x201;
  bstring._7_1_ = 3;
  hrplen = strlen(local_68);
  bstring_00 = bech32_create_bstring(hrplen,3);
  bVar1 = bech32_encode(bstring_00,local_68,(uchar *)((long)&bstring + 5),3);
  if (bVar1 == E_BECH32_UNKNOWN_ERROR) {
    bech32_free_bstring(bstring_00);
    return;
  }
  __assert_fail("bech32_encode(bstring, hrp, dp, sizeof(dp)) == E_BECH32_UNKNOWN_ERROR",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                ,0x129,"void encode_whenCppMethodThrowsException_isUnsuccessful(void)");
}

Assistant:

void encode_whenCppMethodThrowsException_isUnsuccessful(void) {
    // bech32 string can only have HRPs that are 83 chars or less. Attempt to encode an HRP string
    // with more than 83 chars and make sure that the exception thrown in the C++ code is caught
    // and returns an error code
    char hrp[] = "aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa";
    unsigned char dp[] = {1,2,3};
    bech32_bstring *bstring = bech32_create_bstring(strlen(hrp), sizeof(dp));

    assert(bech32_encode(bstring, hrp, dp, sizeof(dp)) == E_BECH32_UNKNOWN_ERROR);

    bech32_free_bstring(bstring);
}